

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTemplate.cpp
# Opt level: O2

string * __thiscall
ki::protocol::dml::MessageTemplate::get_handler_abi_cxx11_
          (string *__return_storage_ptr__,MessageTemplate *this)

{
  Record *this_00;
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pFVar1;
  MessageTemplate *pMVar2;
  allocator local_41;
  string local_40;
  
  this_00 = this->m_record;
  std::__cxx11::string::string((string *)&local_40,"_MsgHandler",&local_41);
  pFVar1 = ki::dml::Record::get_field<std::__cxx11::string>(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pMVar2 = (MessageTemplate *)&pFVar1->m_value;
  if (pFVar1 == (Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    pMVar2 = this;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pMVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string MessageTemplate::get_handler() const
	{
		const auto field = m_record->get_field<ki::dml::STR>("_MsgHandler");
		if (field)
			return field->get_value();
		return m_name;
	}